

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ElsePropertyClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElsePropertyClauseSyntax,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,PropertyExprSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ElsePropertyClauseSyntax *pEVar6;
  
  pEVar6 = (ElsePropertyClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElsePropertyClauseSyntax *)this->endPtr < pEVar6 + 1) {
    pEVar6 = (ElsePropertyClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pEVar6->super_SyntaxNode).kind = ElsePropertyClause;
  (pEVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pEVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pEVar6->elseKeyword).kind = TVar2;
  (pEVar6->elseKeyword).field_0x2 = uVar3;
  (pEVar6->elseKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pEVar6->elseKeyword).rawLen = uVar5;
  (pEVar6->elseKeyword).info = pIVar1;
  (pEVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pEVar6->super_SyntaxNode;
  return pEVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }